

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O1

void fdct8x16_new_avx2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  uint uVar1;
  undefined1 auVar2 [32];
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined7 in_register_00000011;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar24 [32];
  undefined1 auVar55 [32];
  undefined1 auVar59 [32];
  
  uVar6 = (uint)CONCAT71(in_register_00000011,cos_bit);
  lVar13 = (long)(int)uVar6 * 0x100;
  iVar3 = 1 << (cos_bit - 1U & 0x1f);
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x240);
  iVar4 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x170);
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x180);
  uVar14 = iVar7 << 0x10 | uVar1 & 0xffff;
  uVar12 = uVar1 << 0x10 | -iVar7 & 0xffffU;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x1c0);
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x200);
  uVar9 = iVar7 << 0x10 | uVar1 & 0xffff;
  uVar15 = uVar1 << 0x10 | -iVar7 & 0xffffU;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x250);
  uVar18 = iVar4 << 0x10 | uVar1 & 0xffff;
  uVar8 = uVar1 << 0x10 | -iVar4 & 0xffffU;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x1d0);
  iVar4 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x1f0);
  uVar17 = iVar4 << 0x10 | uVar1 & 0xffff;
  uVar19 = uVar1 << 0x10 | -iVar4 & 0xffffU;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x210);
  iVar4 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x1b0);
  uVar11 = iVar4 << 0x10 | uVar1 & 0xffff;
  uVar16 = uVar1 << 0x10 | -iVar4 & 0xffffU;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 400);
  iVar4 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x230);
  uVar10 = iVar4 << 0x10 | uVar1 & 0xffff;
  uVar5 = uVar1 << 0x10 | -iVar4 & 0xffffU;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x1e0);
  auVar29._4_4_ = uVar14;
  auVar29._0_4_ = uVar14;
  auVar29._8_4_ = uVar14;
  auVar29._12_4_ = uVar14;
  auVar39._4_4_ = uVar9;
  auVar39._0_4_ = uVar9;
  auVar39._8_4_ = uVar9;
  auVar39._12_4_ = uVar9;
  auVar34._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar29;
  auVar34._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar39;
  auVar30._4_4_ = uVar12;
  auVar30._0_4_ = uVar12;
  auVar30._8_4_ = uVar12;
  auVar30._12_4_ = uVar12;
  auVar40._4_4_ = uVar15;
  auVar40._0_4_ = uVar15;
  auVar40._8_4_ = uVar15;
  auVar40._12_4_ = uVar15;
  auVar35._0_16_ = ZEXT116(0) * auVar40 + ZEXT116(1) * auVar30;
  auVar35._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar40;
  auVar31._4_4_ = uVar18;
  auVar31._0_4_ = uVar18;
  auVar31._8_4_ = uVar18;
  auVar31._12_4_ = uVar18;
  auVar41._4_4_ = uVar17;
  auVar41._0_4_ = uVar17;
  auVar41._8_4_ = uVar17;
  auVar41._12_4_ = uVar17;
  auVar36._0_16_ = ZEXT116(0) * auVar41 + ZEXT116(1) * auVar31;
  auVar36._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar41;
  auVar32._4_4_ = uVar8;
  auVar32._0_4_ = uVar8;
  auVar32._8_4_ = uVar8;
  auVar32._12_4_ = uVar8;
  auVar42._4_4_ = uVar19;
  auVar42._0_4_ = uVar19;
  auVar42._8_4_ = uVar19;
  auVar42._12_4_ = uVar19;
  auVar37._0_16_ = ZEXT116(0) * auVar42 + ZEXT116(1) * auVar32;
  auVar37._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar42;
  auVar33._4_4_ = uVar11;
  auVar33._0_4_ = uVar11;
  auVar33._8_4_ = uVar11;
  auVar33._12_4_ = uVar11;
  auVar43._4_4_ = uVar10;
  auVar43._0_4_ = uVar10;
  auVar43._8_4_ = uVar10;
  auVar43._12_4_ = uVar10;
  auVar45._0_16_ =
       ZEXT116(0) * (undefined1  [16])input[0xe] + ZEXT116(1) * (undefined1  [16])input[0xf];
  auVar45._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * (undefined1  [16])input[0xe];
  auVar38._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar33;
  auVar38._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar43;
  auVar44._0_16_ =
       ZEXT116(0) * (undefined1  [16])input[0xc] + ZEXT116(1) * (undefined1  [16])input[0xd];
  auVar44._16_16_ = ZEXT116(1) * (undefined1  [16])input[0xc];
  auVar46._0_16_ = ZEXT116(0) * (undefined1  [16])input[4] + ZEXT116(1) * (undefined1  [16])input[5]
  ;
  auVar46._16_16_ = ZEXT116(1) * (undefined1  [16])input[4];
  auVar50._0_16_ = ZEXT116(0) * (undefined1  [16])input[6] + ZEXT116(1) * (undefined1  [16])input[7]
  ;
  auVar50._16_16_ = ZEXT116(1) * (undefined1  [16])input[6];
  uVar8 = -uVar1 & 0xffff | uVar1 * 0x10000;
  auVar21._4_4_ = uVar16;
  auVar21._0_4_ = uVar16;
  auVar21._8_4_ = uVar16;
  auVar21._12_4_ = uVar16;
  auVar26._4_4_ = uVar5;
  auVar26._0_4_ = uVar5;
  auVar26._8_4_ = uVar5;
  auVar26._12_4_ = uVar5;
  auVar23._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar21;
  auVar23._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar26;
  auVar53 = vpaddsw_avx2(*(undefined1 (*) [32])input,auVar45);
  auVar28 = vpsubsw_avx2(*(undefined1 (*) [32])input,auVar45);
  auVar24 = vpaddsw_avx2(*(undefined1 (*) [32])(input + 2),auVar44);
  auVar2 = vpsubsw_avx2(*(undefined1 (*) [32])(input + 2),auVar44);
  auVar44 = vpaddsw_avx2(*(undefined1 (*) [32])(input + 10),auVar46);
  auVar46 = vpsubsw_avx2(auVar46,*(undefined1 (*) [32])(input + 10));
  auVar25 = vpaddsw_avx2(auVar50,*(undefined1 (*) [32])(input + 8));
  auVar50 = vpsubsw_avx2(auVar50,*(undefined1 (*) [32])(input + 8));
  auVar45 = vpaddsw_avx2(auVar25,auVar53);
  auVar27 = vpsubsw_avx2(auVar53,auVar25);
  auVar25 = vpaddsw_avx2(auVar24,auVar44);
  auVar48 = vpsubsw_avx2(auVar24,auVar44);
  auVar51 = vpunpcklwd_avx2(auVar46,auVar2);
  auVar44 = vpunpckhwd_avx2(auVar46,auVar2);
  auVar20._4_4_ = iVar3;
  auVar20._0_4_ = iVar3;
  auVar20._8_4_ = iVar3;
  auVar20._12_4_ = iVar3;
  auVar20._16_4_ = iVar3;
  auVar20._20_4_ = iVar3;
  auVar20._24_4_ = iVar3;
  auVar20._28_4_ = iVar3;
  auVar22._4_4_ = uVar8;
  auVar22._0_4_ = uVar8;
  auVar22._8_4_ = uVar8;
  auVar22._12_4_ = uVar8;
  auVar24._16_4_ = uVar8;
  auVar24._0_16_ = auVar22;
  auVar24._20_4_ = uVar8;
  auVar24._24_4_ = uVar8;
  auVar24._28_4_ = uVar8;
  auVar53 = vpmaddwd_avx2(auVar51,auVar24);
  auVar53 = vpaddd_avx2(auVar53,auVar20);
  auVar24 = vpmaddwd_avx2(auVar44,auVar24);
  auVar24 = vpaddd_avx2(auVar24,auVar20);
  auVar53 = vpsrad_avx2(auVar53,ZEXT416(uVar6));
  auVar24 = vpsrad_avx2(auVar24,ZEXT416(uVar6));
  auVar53 = vpackssdw_avx2(auVar53,auVar24);
  iVar4 = (uVar1 & 0xffff) + uVar1 * 0x10000;
  auVar58._4_4_ = iVar4;
  auVar58._0_4_ = iVar4;
  auVar58._8_4_ = iVar4;
  auVar58._12_4_ = iVar4;
  auVar59._16_4_ = iVar4;
  auVar59._0_16_ = auVar58;
  auVar59._20_4_ = iVar4;
  auVar59._24_4_ = iVar4;
  auVar59._28_4_ = iVar4;
  auVar24 = vpmaddwd_avx2(auVar51,auVar59);
  auVar44 = vpmaddwd_avx2(auVar44,auVar59);
  auVar24 = vpaddd_avx2(auVar24,auVar20);
  auVar29 = ZEXT416(uVar6);
  auVar2 = vpsrad_avx2(auVar24,auVar29);
  auVar24 = vpaddd_avx2(auVar44,auVar20);
  auVar24 = vpsrad_avx2(auVar24,auVar29);
  auVar24 = vpackssdw_avx2(auVar2,auVar24);
  auVar25 = vpermq_avx2(auVar25,0x4e);
  auVar44 = vpaddsw_avx2(auVar25,auVar45);
  auVar2 = vpsubsw_avx2(auVar45,auVar25);
  auVar57 = vpblendd_avx2(auVar27,auVar48,0xf0);
  auVar26 = vpunpcklwd_avx(auVar48._0_16_,auVar27._16_16_);
  auVar21 = vpunpckhwd_avx(auVar48._0_16_,auVar27._16_16_);
  auVar53 = vpermq_avx2(auVar53,0x4e);
  auVar25 = vpaddsw_avx2(auVar50,auVar53);
  auVar46 = vpsubsw_avx2(auVar50,auVar53);
  auVar53 = vpermq_avx2(auVar24,0x4e);
  auVar45 = vpaddsw_avx2(auVar28,auVar53);
  auVar50 = vpsubsw_avx2(auVar28,auVar53);
  auVar53 = vpblendd_avx2(auVar44,auVar2,0xf0);
  auVar24 = vperm2i128_avx2(auVar44,auVar2,0x21);
  auVar44 = vpunpcklwd_avx2(auVar53,auVar24);
  auVar2 = vpunpckhwd_avx2(auVar53,auVar24);
  iVar7 = (uVar1 & 0xffff) + uVar1 * -0x10000;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x220);
  iVar4 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x1a0);
  uVar5 = uVar1 << 0x10 | -iVar4 & 0xffffU;
  uVar8 = uVar1 & 0xffff | iVar4 * 0x10000;
  iVar4 = (-uVar1 & 0xffff) + iVar4 * -0x10000;
  auVar47._4_4_ = uVar5;
  auVar47._0_4_ = uVar5;
  auVar47._8_4_ = uVar5;
  auVar47._12_4_ = uVar5;
  auVar54._4_4_ = uVar8;
  auVar54._0_4_ = uVar8;
  auVar54._8_4_ = uVar8;
  auVar54._12_4_ = uVar8;
  auVar55._16_4_ = uVar8;
  auVar55._0_16_ = auVar54;
  auVar55._20_4_ = uVar8;
  auVar55._24_4_ = uVar8;
  auVar55._28_4_ = uVar8;
  auVar63._4_4_ = iVar7;
  auVar63._0_4_ = iVar7;
  auVar63._8_4_ = iVar7;
  auVar63._12_4_ = iVar7;
  auVar64._0_16_ = ZEXT116(0) * auVar47 + ZEXT116(1) * auVar63;
  auVar64._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar47;
  auVar61._4_4_ = iVar4;
  auVar61._0_4_ = iVar4;
  auVar61._8_4_ = iVar4;
  auVar61._12_4_ = iVar4;
  auVar62._0_16_ = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar47;
  auVar62._16_16_ = ZEXT116(1) * auVar61;
  auVar48._0_16_ = ZEXT116(0) * auVar47 + ZEXT116(1) * auVar54;
  auVar48._16_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar47;
  auVar56._0_16_ = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar58;
  auVar56._16_16_ = ZEXT116(0) * auVar59._16_16_ + ZEXT116(1) * auVar54;
  auVar53 = vpmaddwd_avx2(auVar56,auVar44);
  auVar24 = vpmaddwd_avx2(auVar56,auVar2);
  auVar44 = vpmaddwd_avx2(auVar64,auVar44);
  auVar2 = vpmaddwd_avx2(auVar64,auVar2);
  auVar53 = vpaddd_avx2(auVar53,auVar20);
  auVar28 = vpsrad_avx2(auVar53,auVar29);
  auVar53 = vpaddd_avx2(auVar24,auVar20);
  auVar53 = vpsrad_avx2(auVar53,auVar29);
  auVar53 = vpackssdw_avx2(auVar28,auVar53);
  auVar24 = vpaddd_avx2(auVar44,auVar20);
  auVar44 = vpaddd_avx2(auVar2,auVar20);
  auVar29 = ZEXT416(uVar6);
  auVar24 = vpsrad_avx2(auVar24,auVar29);
  auVar44 = vpsrad_avx2(auVar44,auVar29);
  auVar24 = vpackssdw_avx2(auVar24,auVar44);
  auVar27._0_16_ = ZEXT116(0) * auVar46._0_16_ + ZEXT116(1) * auVar25._0_16_;
  auVar27._16_16_ = ZEXT116(0) * auVar25._16_16_ + ZEXT116(1) * auVar46._0_16_;
  auVar44 = vperm2i128_avx2(auVar25,auVar46,0x31);
  auVar51._0_16_ = ZEXT116(0) * auVar45._0_16_ + ZEXT116(1) * auVar50._0_16_;
  auVar51._16_16_ = ZEXT116(0) * auVar50._16_16_ + ZEXT116(1) * auVar45._0_16_;
  auVar25 = vperm2i128_avx2(auVar45,auVar50,0x31);
  auVar45 = vpunpcklwd_avx2(auVar44,auVar25);
  auVar2 = vpunpckhwd_avx2(auVar44,auVar25);
  auVar44 = vpmaddwd_avx2(auVar62,auVar45);
  auVar25 = vpmaddwd_avx2(auVar62,auVar2);
  auVar45 = vpmaddwd_avx2(auVar45,auVar48);
  auVar2 = vpmaddwd_avx2(auVar2,auVar48);
  auVar44 = vpaddd_avx2(auVar44,auVar20);
  auVar28 = vpsrad_avx2(auVar44,auVar29);
  auVar44 = vpaddd_avx2(auVar25,auVar20);
  auVar44 = vpsrad_avx2(auVar44,auVar29);
  auVar44 = vpackssdw_avx2(auVar28,auVar44);
  auVar25 = vpaddd_avx2(auVar45,auVar20);
  auVar45 = vpaddd_avx2(auVar2,auVar20);
  auVar25 = vpsrad_avx2(auVar25,auVar29);
  auVar45 = vpsrad_avx2(auVar45,auVar29);
  auVar25 = vpackssdw_avx2(auVar25,auVar45);
  auVar45 = vpaddsw_avx2(auVar27,auVar44);
  auVar50 = vpsubsw_avx2(auVar27,auVar44);
  auVar44 = vpermq_avx2(auVar25,0x4e);
  auVar2 = vpaddsw_avx2(auVar51,auVar44);
  auVar27 = vpsubsw_avx2(auVar51,auVar44);
  auVar49._0_16_ = ZEXT116(0) * auVar50._0_16_ + ZEXT116(1) * auVar45._0_16_;
  auVar49._16_16_ = ZEXT116(0) * auVar45._16_16_ + ZEXT116(1) * auVar50._0_16_;
  auVar44 = vperm2i128_avx2(auVar2,auVar27,0x31);
  auVar51 = vpunpcklwd_avx2(auVar49,auVar44);
  auVar48 = vpunpckhwd_avx2(auVar49,auVar44);
  auVar44 = vpmaddwd_avx2(auVar51,auVar36);
  auVar25 = vpmaddwd_avx2(auVar48,auVar36);
  auVar44 = vpaddd_avx2(auVar44,auVar20);
  auVar25 = vpaddd_avx2(auVar25,auVar20);
  auVar44 = vpsrad_avx2(auVar44,auVar29);
  auVar25 = vpsrad_avx2(auVar25,auVar29);
  auVar44 = vpackssdw_avx2(auVar44,auVar25);
  auVar52._0_16_ = ZEXT116(0) * auVar44._0_16_ + ZEXT116(1) * auVar53._0_16_;
  auVar52._16_16_ = ZEXT116(0) * (undefined1  [16])auVar53._16_16_ + ZEXT116(1) * auVar44._0_16_;
  *(undefined1 (*) [32])output = auVar52;
  output[4] = auVar53._16_16_;
  auVar25._0_16_ = ZEXT116(0) * auVar22 + ZEXT116(1) * auVar58;
  auVar25._16_16_ = ZEXT116(0) * auVar59._16_16_ + ZEXT116(1) * auVar22;
  auVar53._0_16_ = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar21;
  auVar53._16_16_ = ZEXT116(1) * auVar21;
  auVar53 = vpmaddwd_avx2(auVar53,auVar25);
  auVar60._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar26;
  auVar60._16_16_ = ZEXT116(1) * auVar26;
  auVar25 = vpmaddwd_avx2(auVar60,auVar25);
  auVar53 = vpaddd_avx2(auVar53,auVar20);
  auVar21 = ZEXT416(uVar6);
  auVar28 = vpsrad_avx2(auVar53,auVar21);
  auVar53 = vpaddd_avx2(auVar25,auVar20);
  auVar53 = vpsrad_avx2(auVar53,auVar21);
  auVar53 = vpackssdw_avx2(auVar53,auVar28);
  auVar25 = vpaddsw_avx2(auVar57,auVar53);
  auVar53 = vpsubsw_avx2(auVar57,auVar53);
  auVar57._0_16_ = ZEXT116(0) * auVar53._0_16_ + ZEXT116(1) * auVar25._0_16_;
  auVar57._16_16_ = ZEXT116(0) * auVar25._16_16_ + ZEXT116(1) * auVar53._0_16_;
  auVar53 = vperm2i128_avx2(auVar25,auVar53,0x31);
  auVar28 = vpunpcklwd_avx2(auVar53,auVar57);
  auVar46 = vpunpckhwd_avx2(auVar53,auVar57);
  auVar53 = vpmaddwd_avx2(auVar28,auVar34);
  auVar25 = vpmaddwd_avx2(auVar34,auVar46);
  auVar28 = vpmaddwd_avx2(auVar28,auVar35);
  auVar46 = vpmaddwd_avx2(auVar35,auVar46);
  auVar53 = vpaddd_avx2(auVar53,auVar20);
  auVar25 = vpaddd_avx2(auVar25,auVar20);
  auVar53 = vpsrad_avx2(auVar53,auVar21);
  auVar25 = vpsrad_avx2(auVar25,auVar21);
  auVar53 = vpackssdw_avx2(auVar53,auVar25);
  auVar25 = vpaddd_avx2(auVar28,auVar20);
  auVar28 = vpsrad_avx2(auVar25,auVar21);
  auVar25 = vpaddd_avx2(auVar46,auVar20);
  auVar25 = vpsrad_avx2(auVar25,auVar21);
  auVar25 = vpackssdw_avx2(auVar28,auVar25);
  auVar28._0_16_ = ZEXT116(0) * auVar2._0_16_ + ZEXT116(1) * auVar27._0_16_;
  auVar28._16_16_ = ZEXT116(0) * auVar27._16_16_ + ZEXT116(1) * auVar2._0_16_;
  auVar45 = vperm2i128_avx2(auVar50,auVar45,0x31);
  auVar27 = vpunpcklwd_avx2(auVar45,auVar28);
  auVar50 = vpunpckhwd_avx2(auVar45,auVar28);
  auVar45 = vpmaddwd_avx2(auVar27,auVar23);
  auVar2 = vpmaddwd_avx2(auVar50,auVar23);
  auVar45 = vpaddd_avx2(auVar45,auVar20);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar45 = vpsrad_avx2(auVar45,auVar21);
  auVar2 = vpsrad_avx2(auVar2,auVar21);
  auVar45 = vpackssdw_avx2(auVar45,auVar2);
  auVar2 = vpblendd_avx2(auVar53,auVar45,0xf0);
  *(undefined1 (*) [32])(output + 2) = auVar2;
  auVar2 = vpmaddwd_avx2(auVar51,auVar37);
  auVar28 = vpmaddwd_avx2(auVar48,auVar37);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar46 = vpsrad_avx2(auVar2,auVar21);
  auVar2 = vpaddd_avx2(auVar28,auVar20);
  auVar2 = vpsrad_avx2(auVar2,auVar21);
  auVar2 = vpackssdw_avx2(auVar46,auVar2);
  auVar53 = vperm2i128_avx2(auVar44,auVar53,0x31);
  output[0xf] = auVar2._0_16_;
  *(undefined1 (*) [32])(output + 9) = auVar53;
  auVar53 = vpmaddwd_avx2(auVar27,auVar38);
  auVar44 = vpmaddwd_avx2(auVar50,auVar38);
  auVar53 = vpaddd_avx2(auVar53,auVar20);
  auVar28 = vpsrad_avx2(auVar53,auVar21);
  auVar53 = vpaddd_avx2(auVar44,auVar20);
  auVar53 = vpsrad_avx2(auVar53,auVar21);
  auVar44 = vperm2i128_avx2(auVar2,auVar24,0x21);
  *(undefined1 (*) [32])(output + 7) = auVar44;
  auVar53 = vpackssdw_avx2(auVar28,auVar53);
  auVar44 = vpblendd_avx2(auVar53,auVar25,0xf0);
  *(undefined1 (*) [32])(output + 5) = auVar44;
  auVar24 = vpblendd_avx2(auVar45,auVar24,0xf0);
  *(undefined1 (*) [32])(output + 0xb) = auVar24;
  auVar53 = vperm2i128_avx2(auVar53,auVar25,0x21);
  *(undefined1 (*) [32])(output + 0xd) = auVar53;
  return;
}

Assistant:

static inline void fdct8x16_new_avx2(const __m128i *input, __m128i *output,
                                     int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i __rounding_256 = _mm256_set1_epi32(1 << (cos_bit - 1));
  const __m128i __rounding = _mm_set1_epi32(1 << (cos_bit - 1));
  __m128i temp0, temp1, temp2, temp3;
  __m256i in0, in1;
  __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);
  __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);
  __m128i cospi_p56_p08 = pair_set_epi16(cospi[56], cospi[8]);
  __m128i cospi_m08_p56 = pair_set_epi16(-cospi[8], cospi[56]);
  __m128i cospi_p24_p40 = pair_set_epi16(cospi[24], cospi[40]);
  __m128i cospi_m40_p24 = pair_set_epi16(-cospi[40], cospi[24]);
  __m128i cospi_p60_p04 = pair_set_epi16(cospi[60], cospi[4]);
  __m128i cospi_m04_p60 = pair_set_epi16(-cospi[4], cospi[60]);
  __m128i cospi_p28_p36 = pair_set_epi16(cospi[28], cospi[36]);
  __m128i cospi_m36_p28 = pair_set_epi16(-cospi[36], cospi[28]);
  __m128i cospi_p44_p20 = pair_set_epi16(cospi[44], cospi[20]);
  __m128i cospi_m20_p44 = pair_set_epi16(-cospi[20], cospi[44]);
  __m128i cospi_p12_p52 = pair_set_epi16(cospi[12], cospi[52]);
  __m128i cospi_m52_p12 = pair_set_epi16(-cospi[52], cospi[12]);

  __m256i cospi_arr[12];

  cospi_arr[0] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_m32_p32),
                                         cospi_m32_p32, 0x1);
  cospi_arr[1] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p32_p32),
                                         cospi_p32_p32, 0x1);
  cospi_arr[2] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p32_p32),
                                         cospi_p48_p16, 0x1);
  cospi_arr[3] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p32_m32),
                                         cospi_m16_p48, 0x1);
  cospi_arr[4] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_m16_p48),
                                         cospi_m48_m16, 0x1);
  cospi_arr[5] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p48_p16),
                                         cospi_m16_p48, 0x1);
  cospi_arr[6] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p56_p08),
                                         cospi_p24_p40, 0x1);
  cospi_arr[7] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_m08_p56),
                                         cospi_m40_p24, 0x1);
  cospi_arr[8] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p60_p04),
                                         cospi_p28_p36, 0x1);
  cospi_arr[9] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_m04_p60),
                                         cospi_m36_p28, 0x1);
  cospi_arr[10] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p44_p20),
                                          cospi_p12_p52, 0x1);
  cospi_arr[11] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_m20_p44),
                                          cospi_m52_p12, 0x1);

  __m256i x[8];
  x[0] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[0]), input[1], 0x1);
  x[1] = _mm256_insertf128_si256(_mm256_castsi128_si256(input[15]), input[14],
                                 0x1);
  x[2] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[2]), input[3], 0x1);
  x[3] = _mm256_insertf128_si256(_mm256_castsi128_si256(input[13]), input[12],
                                 0x1);
  x[4] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[5]), input[4], 0x1);
  x[5] = _mm256_insertf128_si256(_mm256_castsi128_si256(input[10]), input[11],
                                 0x1);
  x[6] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[7]), input[6], 0x1);
  x[7] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[8]), input[9], 0x1);

  // stage 1
  __m256i x1[8];
  x1[0] = _mm256_adds_epi16(x[0], x[1]);
  x1[7] = _mm256_subs_epi16(x[0], x[1]);
  x1[1] = _mm256_adds_epi16(x[2], x[3]);
  x1[6] = _mm256_subs_epi16(x[2], x[3]);
  x1[2] = _mm256_adds_epi16(x[4], x[5]);
  x1[5] = _mm256_subs_epi16(x[4], x[5]);
  x1[3] = _mm256_adds_epi16(x[6], x[7]);
  x1[4] = _mm256_subs_epi16(x[6], x[7]);

  // stage 2
  __m256i x2[8];
  x2[0] = _mm256_adds_epi16(x1[0], x1[3]);
  x2[7] = _mm256_subs_epi16(x1[0], x1[3]);
  x2[1] = _mm256_adds_epi16(x1[1], x1[2]);
  x2[6] = _mm256_subs_epi16(x1[1], x1[2]);
  x2[2] = x1[4];
  x2[3] = x1[7];
  btf_16_avx2(&cospi_arr[0], &cospi_arr[1], &x1[5], &x1[6], &temp0, &temp1,
              &temp2, &temp3, &__rounding_256, &cos_bit);
  x2[4] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp2), temp0, 0x1);
  x2[5] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp3), temp1, 0x1);

  // stage 3
  __m256i x3[8];
  x2[1] = _mm256_permute4x64_epi64(x2[1], 0x4e);
  x3[0] = _mm256_adds_epi16(x2[0], x2[1]);
  x3[1] = _mm256_subs_epi16(x2[0], x2[1]);
  x3[2] = _mm256_blend_epi32(x2[7], x2[6], 0xf0);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, _mm256_castsi256_si128(x2[6]),
              _mm256_extractf128_si256(x2[7], 0x01), temp0, temp1);
  x3[7] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp1), temp0, 0x1);
  x3[3] = _mm256_adds_epi16(x2[2], x2[4]);
  x3[4] = _mm256_subs_epi16(x2[2], x2[4]);
  x3[5] = _mm256_adds_epi16(x2[3], x2[5]);
  x3[6] = _mm256_subs_epi16(x2[3], x2[5]);

  // stage 4
  __m256i x4[8];
  x4[0] = _mm256_blend_epi32(x3[0], x3[1], 0xf0);
  x4[1] = _mm256_permute2f128_si256(x3[0], x3[1], 0x21);
  btf_16_avx2(&cospi_arr[2], &cospi_arr[3], &x4[0], &x4[1], &output[0],
              &output[8], &output[4], &output[12], &__rounding_256, &cos_bit);
  x4[2] = _mm256_adds_epi16(x3[2], x3[7]);
  x4[3] = _mm256_subs_epi16(x3[2], x3[7]);
  x4[4] = _mm256_permute2f128_si256(x3[3], x3[4], 0x20);
  x4[5] = _mm256_permute2f128_si256(x3[6], x3[5], 0x20);
  in0 = _mm256_permute2f128_si256(x3[3], x3[4], 0x31);
  in1 = _mm256_permute2f128_si256(x3[5], x3[6], 0x31);
  btf_16_avx2(&cospi_arr[4], &cospi_arr[5], &in0, &in1, &temp0, &temp1, &temp2,
              &temp3, &__rounding_256, &cos_bit);

  x4[6] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp0), temp2, 0x1);
  x4[7] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp3), temp1, 0x1);

  // stage 5
  __m256i x5[4];
  in0 = _mm256_permute2f128_si256(x4[2], x4[3], 0x31);
  in1 = _mm256_permute2f128_si256(x4[2], x4[3], 0x20);
  btf_16_avx2(&cospi_arr[6], &cospi_arr[7], &in0, &in1, &output[2], &output[14],
              &output[10], &output[6], &__rounding_256, &cos_bit);
  x5[0] = _mm256_adds_epi16(x4[4], x4[6]);
  x5[1] = _mm256_subs_epi16(x4[4], x4[6]);
  x5[2] = _mm256_adds_epi16(x4[5], x4[7]);
  x5[3] = _mm256_subs_epi16(x4[5], x4[7]);

  // stage 6
  in0 = _mm256_permute2f128_si256(x5[0], x5[1], 0x20);
  in1 = _mm256_permute2f128_si256(x5[2], x5[3], 0x31);
  btf_16_avx2(&cospi_arr[8], &cospi_arr[9], &in0, &in1, &output[1], &output[15],
              &output[9], &output[7], &__rounding_256, &cos_bit);
  in0 = _mm256_permute2f128_si256(x5[1], x5[0], 0x31);
  in1 = _mm256_permute2f128_si256(x5[3], x5[2], 0x20);
  btf_16_avx2(&cospi_arr[10], &cospi_arr[11], &in0, &in1, &output[5],
              &output[11], &output[13], &output[3], &__rounding_256, &cos_bit);
}